

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

size_t ma_dr_flac__on_read_memory(void *pUserData,void *bufferOut,size_t bytesToRead)

{
  ulong __n;
  
  __n = *(long *)((long)pUserData + 8) - *(long *)((long)pUserData + 0x10);
  if (bytesToRead <= __n) {
    __n = bytesToRead;
  }
  if (__n != 0) {
    memcpy(bufferOut,(void *)(*(long *)((long)pUserData + 0x10) + *pUserData),__n);
    *(long *)((long)pUserData + 0x10) = *(long *)((long)pUserData + 0x10) + __n;
  }
  return __n;
}

Assistant:

static size_t ma_dr_flac__on_read_memory(void* pUserData, void* bufferOut, size_t bytesToRead)
{
    ma_dr_flac__memory_stream* memoryStream = (ma_dr_flac__memory_stream*)pUserData;
    size_t bytesRemaining;
    MA_DR_FLAC_ASSERT(memoryStream != NULL);
    MA_DR_FLAC_ASSERT(memoryStream->dataSize >= memoryStream->currentReadPos);
    bytesRemaining = memoryStream->dataSize - memoryStream->currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }
    if (bytesToRead > 0) {
        MA_DR_FLAC_COPY_MEMORY(bufferOut, memoryStream->data + memoryStream->currentReadPos, bytesToRead);
        memoryStream->currentReadPos += bytesToRead;
    }
    return bytesToRead;
}